

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_collection.cpp
# Opt level: O2

void __thiscall duckdb::WindowCollection::Combine(WindowCollection *this,ColumnSet *validity_cols)

{
  pointer ppVar1;
  idx_t count;
  bool bVar2;
  pointer pCVar3;
  reference this_00;
  type other;
  reference pvVar4;
  TemplatedValidityMask<unsigned_long> *this_01;
  reference vector;
  reference pvVar5;
  reference this_02;
  __node_base *p_Var6;
  idx_t target_offset;
  pair<unsigned_long,_unsigned_long> *range;
  pointer ppVar7;
  ulong __n;
  vector<unsigned_long,_true> invalid_cols;
  WindowCursor cursor;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  pthread_mutex_t *local_118;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  WindowCursor local_f8;
  
  local_118 = (pthread_mutex_t *)&this->lock;
  ::std::mutex::lock((mutex *)&local_118->__data);
  if ((this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->inputs);
    if (pCVar3->count == 0) {
      ppVar1 = (this->ranges).
               super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               .
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar7 = (this->ranges).
                    super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    .
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar1; ppVar7 = ppVar7 + 1
          ) {
        pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                 ::operator->(&this->inputs);
        this_00 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
                  ::get<true>(&this->collections,ppVar7->second);
        other = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                ::operator*(this_00);
        ColumnDataCollection::Combine(pCVar3,other);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
      ::clear(&(this->collections).
               super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
             );
      ppVar7 = (this->ranges).
               super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               .
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->ranges).
          super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          .
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar7) {
        (this->ranges).
        super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar7;
      }
      if ((validity_cols->_M_h)._M_element_count != 0) {
        local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var6 = &(validity_cols->_M_h)._M_before_begin;
        while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
          pvVar4 = vector<std::atomic<bool>,_true>::get<true>
                             (&this->all_valids,(size_type)p_Var6[1]._M_nxt);
          if (((pvVar4->_M_base)._M_i & 1U) == 0) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            emplace_back<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_138,
                       (unsigned_long *)(p_Var6 + 1));
            this_01 = &vector<duckdb::ValidityMask,_true>::get<true>
                                 (&this->validities,(size_type)p_Var6[1]._M_nxt)->
                       super_TemplatedValidityMask<unsigned_long>;
            pCVar3 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                     ::operator->(&this->inputs);
            TemplatedValidityMask<unsigned_long>::Initialize(this_01,pCVar3->count);
          }
        }
        if (local_138._M_impl.super__Vector_impl_data._M_start !=
            local_138._M_impl.super__Vector_impl_data._M_finish) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_110,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138);
          WindowCursor::WindowCursor(&local_f8,this,(vector<unsigned_long,_true> *)&local_110);
          ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&local_110);
          target_offset = 0;
          while( true ) {
            bVar2 = WindowCursor::Scan(&local_f8);
            count = local_f8.chunk.count;
            if (!bVar2) break;
            for (__n = 0; __n < (ulong)((long)local_138._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_138._M_impl.super__Vector_impl_data._M_start >>
                                       3); __n = __n + 1) {
              vector = vector<duckdb::Vector,_true>::get<true>(&local_f8.chunk.data,__n);
              FlatVector::VerifyFlatVector(vector);
              pvVar5 = vector<unsigned_long,_true>::get<true>
                                 ((vector<unsigned_long,_true> *)&local_138,__n);
              this_02 = vector<duckdb::ValidityMask,_true>::get<true>(&this->validities,*pvVar5);
              ValidityMask::SliceInPlace(this_02,&vector->validity,target_offset,0,count);
            }
            target_offset = target_offset + count;
          }
          WindowCursor::~WindowCursor(&local_f8);
        }
        ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&local_138);
      }
    }
  }
  pthread_mutex_unlock(local_118);
  return;
}

Assistant:

void WindowCollection::Combine(const ColumnSet &validity_cols) {
	lock_guard<mutex> collection_guard(lock);

	// If there are no columns (COUNT(*)) then this is a NOP
	if (types.empty()) {
		return;
	}

	// Have we already combined?
	if (inputs->Count()) {
		D_ASSERT(collections.empty());
		D_ASSERT(ranges.empty());
		return;
	}

	// If there are columns, we should have data
	D_ASSERT(!collections.empty());
	D_ASSERT(!ranges.empty());

	for (auto &range : ranges) {
		inputs->Combine(*collections[range.second]);
	}
	collections.clear();
	ranges.clear();

	if (validity_cols.empty()) {
		return;
	}

	D_ASSERT(inputs.get());

	//	Find all columns with NULLs
	vector<column_t> invalid_cols;
	for (auto &col_idx : validity_cols) {
		if (!all_valids[col_idx]) {
			invalid_cols.emplace_back(col_idx);
			validities[col_idx].Initialize(inputs->Count());
		}
	}

	if (invalid_cols.empty()) {
		return;
	}

	WindowCursor cursor(*this, invalid_cols);
	idx_t target_offset = 0;
	while (cursor.Scan()) {
		const auto count = cursor.chunk.size();
		for (idx_t i = 0; i < invalid_cols.size(); ++i) {
			auto &other = FlatVector::Validity(cursor.chunk.data[i]);
			const auto col_idx = invalid_cols[i];
			validities[col_idx].SliceInPlace(other, target_offset, 0, count);
		}
		target_offset += count;
	}
}